

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestCaseTracking::SectionTracker::tryOpen(SectionTracker *this)

{
  uint uVar1;
  int __oflag;
  char *in_RSI;
  TrackerBase *in_RDI;
  
  uVar1 = (*(in_RDI->super_ITracker)._vptr_ITracker[2])();
  if ((uVar1 & 1) == 0) {
    TrackerBase::open(in_RDI,in_RSI,__oflag);
  }
  return;
}

Assistant:

void SectionTracker::tryOpen() {
        if( !isComplete() )
            open();
    }